

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O2

void __thiscall denialofservice_tests::DoS_bantime::test_method(DoS_bantime *this)

{
  NetGroupManager *__args_3;
  CChainParams *__args_4;
  Warnings *pWVar1;
  Options opts;
  CService ipIn;
  char cVar2;
  int64_t nMockTimeIn;
  char *p2;
  iterator pvVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  shared_ptr<Sock> sock;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  CAddress *addrBindIn;
  undefined4 uVar8;
  uint uVar9;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffa54;
  undefined1 in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa59;
  CNodeOptions *in_stack_fffffffffffffa60;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  allocator<char> local_539;
  undefined1 local_538 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_530;
  undefined2 local_528;
  undefined2 uStack_526;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined2 uStack_51c;
  undefined2 uStack_51a;
  undefined4 local_518;
  undefined1 local_510 [8];
  __single_object connman;
  __single_object banman;
  assertion_result local_4f8;
  _List local_4e0;
  undefined1 local_4d8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock35;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [24];
  string *local_488;
  CNode dummyNode;
  CService local_c0;
  CAddress addr;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock35,&NetEventsInterface::g_msgproc_mutex,
             "NetEventsInterface::g_msgproc_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
             ,0x192,false);
  ArgsManager::GetDataDirBase
            ((path *)&local_60,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
              super_BasicTestingSetup.m_args);
  fs::operator/((path *)&dummyNode,(path *)&local_60,p2);
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  std::make_unique<BanMan,fs::path,decltype(nullptr),unsigned_int_const&>
            ((path *)&banman,(void **)&dummyNode,(uint *)&addr);
  std::filesystem::__cxx11::path::~path((path *)&dummyNode);
  std::filesystem::__cxx11::path::~path(&local_60);
  dummyNode.m_transport._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
  super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
  super__Head_base<0UL,_Transport_*,_false>._M_head_impl._0_4_ = 0x1337;
  addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = 0x1337;
  __args_3 = (NetGroupManager *)
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.addrman._M_t.
             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  __args_4 = (CChainParams *)
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.netgroupman._M_t.
             super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
             .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  Params();
  std::make_unique<CConnman,int,int,AddrMan&,NetGroupManager_const&,CChainParams_const&>
            ((int *)&connman,(int *)&dummyNode,(AddrMan *)&addr,__args_3,__args_4);
  pWVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.warnings._M_t.
           super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
           super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
           super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  local_528 = 0;
  uStack_524 = 100;
  uStack_520 = 100;
  uStack_51c = 0;
  local_518 = 2000;
  uVar10 = 2000;
  lVar7 = (ulong)CONCAT42(100,uStack_526) << 0x10;
  uVar8 = 100;
  uVar9 = (uint)(CONCAT26(uStack_51a,100) >> 0x20);
  uVar5 = SUB84(pWVar1,0);
  uVar6 = (undefined4)((ulong)pWVar1 >> 0x20);
  opts.max_extra_txs = (int)lVar7;
  opts.capture_messages = (bool)(char)((ulong)lVar7 >> 0x20);
  opts.deterministic_rng = (bool)(char)((ulong)lVar7 >> 0x28);
  opts._14_2_ = (short)((ulong)lVar7 >> 0x30);
  opts._0_8_ = pWVar1;
  opts.max_headers_result = 100;
  PeerManager::make((CConnman *)local_510,
                    (AddrMan *)
                    connman._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>.
                    _M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
                    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl,
                    (BanMan *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (ChainstateManager *)
                    banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                    super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                    super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,
                    (CTxMemPool *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.chainman._M_t.
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                    (Warnings *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,opts);
  BanMan::ClearBanned((BanMan *)
                      banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                      super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                      super__Head_base<0UL,_BanMan_*,_false>._M_head_impl);
  nMockTimeIn = GetTime();
  SetMockTime(nMockTimeIn);
  ip(&local_c0,0xa0b0c001);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar6;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar5;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = lVar7;
  ipIn.super_CNetAddr.m_addr._size = uVar8;
  ipIn.super_CNetAddr.m_addr._20_4_ = uVar9;
  ipIn.super_CNetAddr.m_net = uVar10;
  ipIn.super_CNetAddr.m_scope_id = in_stack_fffffffffffffa54;
  ipIn.port._0_1_ = in_stack_fffffffffffffa58;
  ipIn._33_7_ = in_stack_fffffffffffffa59;
  CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_c0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c0);
  local_538 = (undefined1  [8])0x0;
  _Stack_530._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CAddress::CAddress((CAddress *)local_4a0);
  addrBindIn = (CAddress *)local_4c0;
  std::__cxx11::string::string<std::allocator<char>>((string *)addrBindIn,"",&local_539);
  local_4f8._0_4_ = 0;
  local_4f8.m_message.px = (element_type *)0x0;
  local_4f8.m_message.pn.pi_ = local_4f8.m_message.pn.pi_ & 0xffffffffffffff00;
  local_4e0._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x4c4b40;
  local_4d8 = 0;
  pvVar3 = (iterator)0x4;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&addr;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_538;
  pvVar4 = pvVar3;
  CNode::CNode(&dummyNode,0,sock,(CAddress *)0x4,4,(uint64_t)local_4a0,addrBindIn,
               (string *)((ulong)uVar9 << 0x20),INBOUND,SUB81(&local_4f8,0),
               in_stack_fffffffffffffa60);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_4f8.m_message);
  std::__cxx11::string::~string((string *)local_4c0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_4a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_530);
  LOCK();
  dummyNode.m_greatest_common_version.super___atomic_base<int>._M_i = (__atomic_base<int>)0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)((long)local_510 + 8))((long *)((long)local_510 + 8),&dummyNode,1);
  LOCK();
  dummyNode.fSuccessfullyConnected._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  (**(code **)(*(long *)local_510 + 0x98))(local_510,dummyNode.id);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar4;
  msg.m_begin = pvVar3;
  file.m_end = (iterator)0x1ac;
  file.m_begin = (iterator)&local_550;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_560,msg);
  cVar2 = (**(code **)(*(long *)((long)local_510 + 8) + 0x20))
                    ((long *)((long)local_510 + 8),&dummyNode);
  local_4f8.m_message.px = (element_type *)0x0;
  local_4f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4c0._0_8_ = "peerLogic->SendMessages(&dummyNode)";
  local_4c0._8_8_ = (long)"peerLogic->SendMessages(&dummyNode)" + 0x23;
  local_4a0[8] = '\0';
  local_4a0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_568 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_488 = (string *)local_4c0;
  local_4f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)cVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_4f8,(lazy_ostream *)local_4a0,1,0,WARN,(check_type)addrBindIn,(size_t)&local_570
             ,0x1ac);
  boost::detail::shared_count::~shared_count(&local_4f8.m_message.pn);
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x1ad;
  file_00.m_begin = (iterator)&local_580;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_590,
             msg_00);
  local_4f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)&addr);
  local_4f8.m_message.px = (element_type *)0x0;
  local_4f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4c0._0_8_ = "banman->IsDiscouraged(addr)";
  local_4c0._8_8_ = (long)"banman->IsDiscouraged(addr)" + 0x1b;
  local_4a0[8] = '\0';
  local_4a0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_488 = (string *)local_4c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4f8,(lazy_ostream *)local_4a0,1,0,WARN,(check_type)addrBindIn,
             (size_t)&stack0xfffffffffffffa60,0x1ad);
  boost::detail::shared_count::~shared_count(&local_4f8.m_message.pn);
  (**(code **)(*(long *)((long)local_510 + 8) + 8))((long *)((long)local_510 + 8),&dummyNode);
  CNode::~CNode(&dummyNode);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (local_510 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_510 + 0x58))();
  }
  std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::~unique_ptr(&connman);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::~unique_ptr(&banman);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock35.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(DoS_bantime)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    auto banman = std::make_unique<BanMan>(m_args.GetDataDirBase() / "banlist", nullptr, DEFAULT_MISBEHAVING_BANTIME);
    auto connman = std::make_unique<CConnman>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, banman.get(), *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    banman->ClearBanned();
    int64_t nStartTime = GetTime();
    SetMockTime(nStartTime); // Overrides future calls to GetTime()

    CAddress addr(ip(0xa0b0c001), NODE_NONE);
    NodeId id{0};
    CNode dummyNode{id++,
                    /*sock=*/nullptr,
                    addr,
                    /*nKeyedNetGroupIn=*/4,
                    /*nLocalHostNonceIn=*/4,
                    CAddress(),
                    /*addrNameIn=*/"",
                    ConnectionType::INBOUND,
                    /*inbound_onion=*/false};
    dummyNode.SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(dummyNode, NODE_NETWORK);
    dummyNode.fSuccessfullyConnected = true;

    peerLogic->UnitTestMisbehaving(dummyNode.GetId());
    BOOST_CHECK(peerLogic->SendMessages(&dummyNode));
    BOOST_CHECK(banman->IsDiscouraged(addr));

    peerLogic->FinalizeNode(dummyNode);
}